

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O3

int htmlCtxtUseOptions(htmlParserCtxtPtr ctxt,int options)

{
  byte *pbVar1;
  _xmlSAXHandler *p_Var2;
  uint uVar3;
  bool bVar4;
  
  if (ctxt != (htmlParserCtxtPtr)0x0) {
    if ((options & 0x40U) != 0) {
      ctxt->sax->warning = (warningSAXFunc)0x0;
      (ctxt->vctxt).warning = (xmlValidityWarningFunc)0x0;
      options = options - 0x40;
      *(byte *)&ctxt->options = (byte)ctxt->options | 0x40;
    }
    if ((options & 0x20U) != 0) {
      p_Var2 = ctxt->sax;
      p_Var2->error = (errorSAXFunc)0x0;
      (ctxt->vctxt).error = (xmlValidityErrorFunc)0x0;
      p_Var2->fatalError = (fatalErrorSAXFunc)0x0;
      options = options - 0x20;
      *(byte *)&ctxt->options = (byte)ctxt->options | 0x20;
    }
    bVar4 = (char)options < '\0';
    if (bVar4) {
      options = options - 0x80;
      *(byte *)&ctxt->options = (byte)ctxt->options | 0x80;
    }
    ctxt->pedantic = (uint)bVar4;
    bVar4 = ((uint)options >> 8 & 1) == 0;
    if (!bVar4) {
      ctxt->sax->ignorableWhitespace = xmlSAX2IgnorableWhitespace;
      options = options - 0x100;
      pbVar1 = (byte *)((long)&ctxt->options + 1);
      *pbVar1 = *pbVar1 | 1;
    }
    ctxt->keepBlanks = (uint)bVar4;
    uVar3 = options & 0xfffffffe;
    ctxt->recovery = options & 1;
    if (((uint)options >> 0x10 & 1) != 0) {
      pbVar1 = (byte *)((long)&ctxt->options + 2);
      *pbVar1 = *pbVar1 | 1;
      uVar3 = uVar3 - 0x10000;
    }
    if ((uVar3 >> 0x13 & 1) != 0) {
      pbVar1 = (byte *)((long)&ctxt->options + 2);
      *pbVar1 = *pbVar1 | 8;
      uVar3 = uVar3 - 0x80000;
    }
    if ((uVar3 & 4) != 0) {
      *(byte *)&ctxt->options = (byte)ctxt->options | 4;
      uVar3 = uVar3 - 4;
    }
    if ((uVar3 >> 0x15 & 1) != 0) {
      pbVar1 = (byte *)((long)&ctxt->options + 2);
      *pbVar1 = *pbVar1 | 0x20;
      uVar3 = uVar3 - 0x200000;
    }
    if ((uVar3 >> 0xd & 1) != 0) {
      pbVar1 = (byte *)((long)&ctxt->options + 1);
      *pbVar1 = *pbVar1 | 0x20;
      uVar3 = uVar3 - 0x2000;
    }
    ctxt->dictNames = 0;
    return uVar3;
  }
  return -1;
}

Assistant:

int
htmlCtxtUseOptions(htmlParserCtxtPtr ctxt, int options)
{
    if (ctxt == NULL)
        return(-1);

    if (options & HTML_PARSE_NOWARNING) {
        ctxt->sax->warning = NULL;
        ctxt->vctxt.warning = NULL;
        options -= XML_PARSE_NOWARNING;
	ctxt->options |= XML_PARSE_NOWARNING;
    }
    if (options & HTML_PARSE_NOERROR) {
        ctxt->sax->error = NULL;
        ctxt->vctxt.error = NULL;
        ctxt->sax->fatalError = NULL;
        options -= XML_PARSE_NOERROR;
	ctxt->options |= XML_PARSE_NOERROR;
    }
    if (options & HTML_PARSE_PEDANTIC) {
        ctxt->pedantic = 1;
        options -= XML_PARSE_PEDANTIC;
	ctxt->options |= XML_PARSE_PEDANTIC;
    } else
        ctxt->pedantic = 0;
    if (options & XML_PARSE_NOBLANKS) {
        ctxt->keepBlanks = 0;
        ctxt->sax->ignorableWhitespace = xmlSAX2IgnorableWhitespace;
        options -= XML_PARSE_NOBLANKS;
	ctxt->options |= XML_PARSE_NOBLANKS;
    } else
        ctxt->keepBlanks = 1;
    if (options & HTML_PARSE_RECOVER) {
        ctxt->recovery = 1;
	options -= HTML_PARSE_RECOVER;
    } else
        ctxt->recovery = 0;
    if (options & HTML_PARSE_COMPACT) {
	ctxt->options |= HTML_PARSE_COMPACT;
        options -= HTML_PARSE_COMPACT;
    }
    if (options & XML_PARSE_HUGE) {
	ctxt->options |= XML_PARSE_HUGE;
        options -= XML_PARSE_HUGE;
    }
    if (options & HTML_PARSE_NODEFDTD) {
	ctxt->options |= HTML_PARSE_NODEFDTD;
        options -= HTML_PARSE_NODEFDTD;
    }
    if (options & HTML_PARSE_IGNORE_ENC) {
	ctxt->options |= HTML_PARSE_IGNORE_ENC;
        options -= HTML_PARSE_IGNORE_ENC;
    }
    if (options & HTML_PARSE_NOIMPLIED) {
        ctxt->options |= HTML_PARSE_NOIMPLIED;
        options -= HTML_PARSE_NOIMPLIED;
    }
    ctxt->dictNames = 0;
    return (options);
}